

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::inc_r(GB *this,u8 *r)

{
  u8 uVar1;
  u8 *r_local;
  GB *this_local;
  
  uVar1 = inc(this,*r);
  *r = uVar1;
  op_done(this);
  return;
}

Assistant:

void GB::inc_r(u8& r) {
  r = inc(r);
  op_done();
}